

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<short>::test_one<(libdivide::Branching)1>
          (DivideTest<short> *this,short numer,short denom,
          divider<short,_(libdivide::Branching)1> *the_divider)

{
  byte bVar1;
  int iVar2;
  short sVar3;
  int32_t xl;
  string_class local_50;
  
  if (denom != -1 || numer != -0x8000) {
    bVar1 = (the_divider->div).denom.more;
    iVar2 = (int)(the_divider->div).denom.magic;
    sVar3 = (short)((uint)(iVar2 * numer) >> 0x10) + numer;
    sVar3 = ((ushort)((int)(short)((sVar3 >> 0xf &
                                   (short)(1 << (bVar1 & 0x1f)) - (ushort)(iVar2 == 0)) + sVar3) >>
                     (bVar1 & 0x1f)) ^ (short)((char)bVar1 >> 7)) - (short)((char)bVar1 >> 7);
    if (numer / denom != sVar3) {
      std::operator<<((ostream *)&std::cerr,"Failure for ");
      testcase_name_abi_cxx11_(&local_50,this,1);
      std::operator<<((ostream *)&std::cerr,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator<<((ostream *)&std::cerr,": ");
      std::ostream::operator<<((ostream *)&std::cerr,numer);
      std::operator<<((ostream *)&std::cerr," / ");
      std::ostream::operator<<((ostream *)&std::cerr,denom);
      std::operator<<((ostream *)&std::cerr," = ");
      std::ostream::operator<<((ostream *)&std::cerr,numer / denom);
      std::operator<<((ostream *)&std::cerr,", but got ");
      std::ostream::operator<<((ostream *)&std::cerr,sVar3);
      std::operator<<((ostream *)&std::cerr,"\n");
      exit(1);
    }
  }
  return;
}

Assistant:

void test_one(T numer, T denom, const divider<T, ALGO> &the_divider) {
        // Don't crash with INT_MIN / -1
        // INT_MIN / -1 is undefined behavior in C/C++
        if (limits::is_signed && numer == (limits::min)() && denom == T(-1)) {
            return;
        }

        T expect = numer / denom;
        T result = numer / the_divider;

        if (result != expect) {
            PRINT_ERROR(F("Failure for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(numer);
            PRINT_ERROR(F(" / "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(" = "));
            PRINT_ERROR(expect);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(result);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }
    }